

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Colour::Valid(Colour *this)

{
  bool bVar1;
  
  if (this->mastering_metadata_ == (MasteringMetadata *)0x0) {
LAB_0011c3e8:
    if (this->matrix_coefficients_ != 0xffffffffffffffff) {
      bVar1 = IsMatrixCoefficientsValueValid(this->matrix_coefficients_);
      if (!bVar1) goto LAB_0011c45d;
    }
    if (this->chroma_siting_horz_ != 0xffffffffffffffff) {
      bVar1 = IsChromaSitingHorzValueValid(this->chroma_siting_horz_);
      if (!bVar1) goto LAB_0011c45d;
    }
    if (this->chroma_siting_vert_ != 0xffffffffffffffff) {
      bVar1 = IsChromaSitingVertValueValid(this->chroma_siting_vert_);
      if (!bVar1) goto LAB_0011c45d;
    }
    if (this->range_ != 0xffffffffffffffff) {
      bVar1 = IsColourRangeValueValid(this->range_);
      if (!bVar1) goto LAB_0011c45d;
    }
    if (this->transfer_characteristics_ != 0xffffffffffffffff) {
      bVar1 = IsTransferCharacteristicsValueValid(this->transfer_characteristics_);
      if (!bVar1) goto LAB_0011c45d;
    }
    if (this->primaries_ != 0xffffffffffffffff) {
      bVar1 = IsPrimariesValueValid(this->primaries_);
      if (!bVar1) goto LAB_0011c45d;
    }
    bVar1 = true;
  }
  else {
    bVar1 = MasteringMetadata::Valid(this->mastering_metadata_);
    if (bVar1) goto LAB_0011c3e8;
LAB_0011c45d:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Colour::Valid() const {
  if (mastering_metadata_ && !mastering_metadata_->Valid())
    return false;
  if (matrix_coefficients_ != kValueNotPresent &&
      !IsMatrixCoefficientsValueValid(matrix_coefficients_)) {
    return false;
  }
  if (chroma_siting_horz_ != kValueNotPresent &&
      !IsChromaSitingHorzValueValid(chroma_siting_horz_)) {
    return false;
  }
  if (chroma_siting_vert_ != kValueNotPresent &&
      !IsChromaSitingVertValueValid(chroma_siting_vert_)) {
    return false;
  }
  if (range_ != kValueNotPresent && !IsColourRangeValueValid(range_))
    return false;
  if (transfer_characteristics_ != kValueNotPresent &&
      !IsTransferCharacteristicsValueValid(transfer_characteristics_)) {
    return false;
  }
  if (primaries_ != kValueNotPresent && !IsPrimariesValueValid(primaries_))
    return false;

  return true;
}